

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt_cstr.c
# Opt level: O0

char * zt_cstr_map(char *s,ssize_t i,ssize_t j,char *from,char *to)

{
  char cVar1;
  byte bVar2;
  size_t sVar3;
  ssize_t sVar4;
  byte *in_RCX;
  char *in_RDI;
  char *in_R8;
  bool bVar5;
  ssize_t t;
  size_t len;
  char *p;
  char *new;
  uchar map [256];
  size_t in_stack_fffffffffffffe98;
  undefined7 in_stack_fffffffffffffea0;
  undefined1 in_stack_fffffffffffffea7;
  char *local_148;
  char local_138 [264];
  char *local_30;
  byte *local_28;
  ssize_t local_20;
  ssize_t local_18;
  char *local_10;
  char *local_8;
  
  local_30 = in_R8;
  local_28 = in_RCX;
  local_10 = in_RDI;
  memcpy(local_138,&DAT_0015f220,0x100);
  if ((local_28 != (byte *)0x0) && (local_30 != (char *)0x0)) {
    while( true ) {
      bVar5 = false;
      if (*local_28 != 0) {
        bVar5 = *local_30 != '\0';
      }
      if (!bVar5) break;
      cVar1 = *local_30;
      bVar2 = *local_28;
      local_30 = local_30 + 1;
      local_28 = local_28 + 1;
      local_138[bVar2] = cVar1;
    }
    in_stack_fffffffffffffea7 = 0;
  }
  if (local_10 == (char *)0x0) {
    local_8 = (char *)0x0;
  }
  else {
    sVar3 = strlen(local_10);
    if (sVar3 == 0) {
      local_18 = 0;
      local_20 = 0;
    }
    else {
      local_18 = IDX(CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                     in_stack_fffffffffffffe98);
      sVar4 = IDX(CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0),
                  in_stack_fffffffffffffe98);
      local_20 = sVar4;
      if (sVar4 < local_18) {
        local_20 = local_18;
        local_18 = sVar4;
      }
    }
    IDXLEN(local_18,local_20);
    local_8 = (char *)zt_malloc_p(CONCAT17(in_stack_fffffffffffffea7,in_stack_fffffffffffffea0));
    local_148 = local_8;
    while (sVar4 = local_18, local_18 <= local_20) {
      local_18 = local_18 + 1;
      *local_148 = local_138[(byte)local_10[sVar4]];
      local_148 = local_148 + 1;
    }
    *local_148 = '\0';
  }
  return local_8;
}

Assistant:

char *
zt_cstr_map(const char *s, ssize_t i, ssize_t j,
            const char *from, const char *to) {
    unsigned char map[256] = { 0,   1,   2,   3,   4,   5,   6,   7,   8,   9,
                               10,  11,  12,  13,  14,  15,  16,  17,  18,  19,
                               20,  21,  22,  23,  24,  25,  26,  27,  28,  29,
                               30,  31,  32,  33,  34,  35,  36,  37,  38,  39,
                               40,  41,  42,  43,  44,  45,  46,  47,  48,  49,
                               50,  51,  52,  53,  54,  55,  56,  57,  58,  59,
                               60,  61,  62,  63,  64,  65,  66,  67,  68,  69,
                               70,  71,  72,  73,  74,  75,  76,  77,  78,  79,
                               80,  81,  82,  83,  84,  85,  86,  87,  88,  89,
                               90,  91,  92,  93,  94,  95,  96,  97,  98,  99,
                               100, 101, 102, 103, 104, 105, 106, 107, 108, 109,
                               110, 111, 112, 113, 114, 115, 116, 117, 118, 119,
                               120, 121, 122, 123, 124, 125, 126, 127, 128, 129,
                               130, 131, 132, 133, 134, 135, 136, 137, 138, 139,
                               140, 141, 142, 143, 144, 145, 146, 147, 148, 149,
                               150, 151, 152, 153, 154, 155, 156, 157, 158, 159,
                               160, 161, 162, 163, 164, 165, 166, 167, 168, 169,
                               170, 171, 172, 173, 174, 175, 176, 177, 178, 179,
                               180, 181, 182, 183, 184, 185, 186, 187, 188, 189,
                               190, 191, 192, 193, 194, 195, 196, 197, 198, 199,
                               200, 201, 202, 203, 204, 205, 206, 207, 208, 209,
                               210, 211, 212, 213, 214, 215, 216, 217, 218, 219,
                               220, 221, 222, 223, 224, 225 };

    if (from && to) {
        while (*from && *to) {
            map[(unsigned char)*from++] = *to++;
        }

        zt_assert(*from == 0 && *to == 0);
    }

    if (s) {
        char * new;
        char * p;

        CONVERT(s, i, j);
        p  = new = zt_malloc(char, IDXLEN(i, j) + 1);
        while (i <= j) {
            *p++ = map[(unsigned char)s[i++]];
        }
        *p = '\0';
        return new;
    }

    return NULL;
}